

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * atomcmd_a(iasctx *ctx,void *v,int spos)

{
  easm_expr *peVar1;
  int iVar2;
  matches *pmVar3;
  easm_expr *e;
  int spos_local;
  void *v_local;
  iasctx *ctx_local;
  
  if ((((spos != ctx->atomsnum) && (ctx->atoms[spos]->type == LITEM_EXPR)) &&
      (peVar1 = ctx->atoms[spos]->expr, peVar1->type == EASM_EXPR_LABEL)) &&
     (iVar2 = strcmp(peVar1->str,(char *)v), iVar2 == 0)) {
    pmVar3 = alwaysmatches(spos + 1);
    return pmVar3;
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomcmd_a APROTO {
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct easm_expr *e = ctx->atoms[spos]->expr;
	if (e->type == EASM_EXPR_LABEL && !strcmp(e->str, v))
		return alwaysmatches(spos+1);
	else
		return 0;
}